

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O1

String * __thiscall
stick::URI::decode(String *__return_storage_ptr__,URI *this,String *_str,Error *_error)

{
  char cVar1;
  char _args;
  Allocator *pAVar2;
  Size SVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  DefaultAllocator *pDVar6;
  int iVar7;
  undefined4 extraout_var;
  char *pcVar9;
  int *piVar10;
  long lVar11;
  undefined4 extraout_var_00;
  ErrorCategory *pEVar12;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined1 auVar13 [8];
  _func_int **__s;
  char _args_1;
  UInt32 _line;
  char *pcVar15;
  char *pcVar16;
  bool bVar17;
  ErrorCategory *local_f0;
  long local_e8;
  ulong local_e0;
  ErrorCategory *local_d8;
  Error local_d0;
  String local_78;
  undefined1 auStack_58 [8];
  String tmp2;
  _func_int **pp_Var8;
  undefined4 extraout_var_01;
  String *pSVar14;
  
  tmp2.m_allocator = (Allocator *)__return_storage_ptr__;
  if (defaultAllocator()::m_def == '\0') {
    decode();
  }
  pAVar2 = tmp2.m_allocator;
  pDVar6 = defaultAllocator::m_def;
  (tmp2.m_allocator)->_vptr_Allocator = (_func_int **)0x0;
  tmp2.m_allocator[1]._vptr_Allocator = (_func_int **)0x0;
  tmp2.m_allocator[2]._vptr_Allocator = (_func_int **)0x0;
  tmp2.m_allocator[3]._vptr_Allocator = (_func_int **)pDVar6;
  pEVar12 = (ErrorCategory *)(tmp2.m_allocator)->_vptr_Allocator;
  iVar7 = (*(pDVar6->super_Allocator)._vptr_Allocator[2])(pDVar6,0x81,1);
  pp_Var8 = (_func_int **)CONCAT44(extraout_var,iVar7);
  pAVar2->_vptr_Allocator = pp_Var8;
  memset(pp_Var8,0,0x81);
  pSVar14 = (String *)tmp2.m_allocator;
  if (pp_Var8 != (_func_int **)0x0) {
    if (pEVar12 != (ErrorCategory *)0x0) {
      strcpy((char *)pp_Var8,(char *)pEVar12);
      local_d0._8_8_ = (long)((Allocator *)((long)pSVar14 + 0x10))->_vptr_Allocator + 1;
      local_d0.m_category = pEVar12;
      (**(code **)(*((Allocator *)((long)pSVar14 + 0x18))->_vptr_Allocator + 0x18))();
    }
    ((Allocator *)((long)pSVar14 + 0x10))->_vptr_Allocator = (_func_int **)0x80;
    if (_str->m_length != 0) {
      pcVar16 = _str->m_cStr;
      pcVar9 = pcVar16 + _str->m_length;
      local_e0 = 0;
      do {
        cVar1 = *pcVar16;
        if (cVar1 == '%') {
          pcVar15 = pcVar16 + 1;
          if (pcVar15 == pcVar9) {
            if (defaultAllocator()::m_def == '\0') {
              decode();
            }
            auStack_58 = (undefined1  [8])0x0;
            tmp2.m_cStr = (char *)0x0;
            tmp2.m_length = 0;
            tmp2.m_capacity = (Size)defaultAllocator::m_def;
            iVar7 = (*(defaultAllocator::m_def->super_Allocator)._vptr_Allocator[2])
                              (defaultAllocator::m_def,0x30,1);
            auStack_58 = (undefined1  [8])CONCAT44(extraout_var_03,iVar7);
            (((ErrorCategory *)auStack_58)->m_name).m_allocator = (Allocator *)0x0;
            ((ErrorCategory *)((long)auStack_58 + 0x28))->_vptr_ErrorCategory = (_func_int **)0x0;
            (((ErrorCategory *)auStack_58)->m_name).m_length = 0;
            (((ErrorCategory *)auStack_58)->m_name).m_capacity = 0;
            ((ErrorCategory *)auStack_58)->_vptr_ErrorCategory = (_func_int **)0x0;
            (((ErrorCategory *)auStack_58)->m_name).m_cStr = (char *)0x0;
            if (auStack_58 == (undefined1  [8])0x0) goto LAB_0011be2a;
            (((ErrorCategory *)auStack_58)->m_name).m_allocator = (Allocator *)0x6e65637265702065;
            ((ErrorCategory *)((long)auStack_58 + 0x28))->_vptr_ErrorCategory =
                 (_func_int **)0x216e6769732074;
            (((ErrorCategory *)auStack_58)->m_name).m_length = 0x66206f7420657661;
            (((ErrorCategory *)auStack_58)->m_name).m_capacity = 0x687420776f6c6c6f;
            ((ErrorCategory *)auStack_58)->_vptr_ErrorCategory = (_func_int **)0x20786568206f7754;
            (((ErrorCategory *)auStack_58)->m_name).m_cStr = (char *)0x6820737469676964;
            _line = 0x138;
          }
          else {
            pcVar15 = pcVar16 + 2;
            if (pcVar15 == pcVar9) {
              if (defaultAllocator()::m_def == '\0') {
                decode();
              }
              auStack_58 = (undefined1  [8])0x0;
              tmp2.m_cStr = (char *)0x0;
              tmp2.m_length = 0;
              tmp2.m_capacity = (Size)defaultAllocator::m_def;
              iVar7 = (*(defaultAllocator::m_def->super_Allocator)._vptr_Allocator[2])
                                (defaultAllocator::m_def,0x30,1);
              auStack_58 = (undefined1  [8])CONCAT44(extraout_var_05,iVar7);
              (((ErrorCategory *)auStack_58)->m_name).m_allocator = (Allocator *)0x0;
              ((ErrorCategory *)((long)auStack_58 + 0x28))->_vptr_ErrorCategory = (_func_int **)0x0;
              (((ErrorCategory *)auStack_58)->m_name).m_length = 0;
              (((ErrorCategory *)auStack_58)->m_name).m_capacity = 0;
              ((ErrorCategory *)auStack_58)->_vptr_ErrorCategory = (_func_int **)0x0;
              (((ErrorCategory *)auStack_58)->m_name).m_cStr = (char *)0x0;
              if (auStack_58 == (undefined1  [8])0x0) goto LAB_0011be2a;
              (((ErrorCategory *)auStack_58)->m_name).m_allocator = (Allocator *)0x6e65637265702065;
              ((ErrorCategory *)((long)auStack_58 + 0x28))->_vptr_ErrorCategory =
                   (_func_int **)0x216e6769732074;
              (((ErrorCategory *)auStack_58)->m_name).m_length = 0x66206f7420657661;
              (((ErrorCategory *)auStack_58)->m_name).m_capacity = 0x687420776f6c6c6f;
              ((ErrorCategory *)auStack_58)->_vptr_ErrorCategory = (_func_int **)0x20786568206f7754;
              (((ErrorCategory *)auStack_58)->m_name).m_cStr = (char *)0x6820737469676964;
              _line = 0x144;
            }
            else {
              cVar1 = pcVar16[1];
              _args = *pcVar15;
              iVar7 = isxdigit((int)cVar1);
              _args_1 = (char)pSVar14;
              if ((iVar7 != 0) && (iVar7 = isxdigit((int)_args), iVar7 != 0)) {
                String::concat<char,char>
                          ((String *)auStack_58,(String *)(ulong)(uint)(int)cVar1,_args,_args_1);
                piVar10 = __errno_location();
                *piVar10 = 0;
                lVar11 = strtol((char *)auStack_58,(char **)0x0,0x10);
                bVar17 = *piVar10 == 0;
                if (bVar17) {
                  pp_Var4 = tmp2.m_allocator[1]._vptr_Allocator;
                  pp_Var8 = (_func_int **)((long)pp_Var4 + 1);
                  if ((tmp2.m_allocator[2]._vptr_Allocator < pp_Var8) &&
                     (pp_Var5 = (_func_int **)((long)pp_Var8 * 2),
                     tmp2.m_allocator[2]._vptr_Allocator < pp_Var5)) {
                    local_d8 = (ErrorCategory *)(tmp2.m_allocator)->_vptr_Allocator;
                    __s = (_func_int **)
                          (**(code **)(*tmp2.m_allocator[3]._vptr_Allocator + 0x10))
                                    (tmp2.m_allocator[3]._vptr_Allocator,(ulong)pp_Var5 | 1,1);
                    (tmp2.m_allocator)->_vptr_Allocator = __s;
                    memset(__s,0,(ulong)pp_Var5 | 1);
                    if ((tmp2.m_allocator)->_vptr_Allocator == (_func_int **)0x0) goto LAB_0011be2a;
                    if (local_d8 != (ErrorCategory *)0x0) {
                      strcpy((char *)(tmp2.m_allocator)->_vptr_Allocator,(char *)local_d8);
                      local_d0._8_8_ = (long)tmp2.m_allocator[2]._vptr_Allocator + 1;
                      local_d0.m_category = local_d8;
                      (**(code **)(*tmp2.m_allocator[3]._vptr_Allocator + 0x18))
                                (tmp2.m_allocator[3]._vptr_Allocator,&local_d0);
                    }
                    tmp2.m_allocator[2]._vptr_Allocator = pp_Var5;
                  }
                  tmp2.m_allocator[1]._vptr_Allocator = pp_Var8;
                  *(char *)((long)(tmp2.m_allocator)->_vptr_Allocator + (long)pp_Var4) =
                       (char)lVar11;
                }
                else {
                  if (defaultAllocator()::m_def == '\0') {
                    decode();
                  }
                  local_78.m_cStr = (char *)0x0;
                  local_78.m_length = 0;
                  local_78.m_capacity = 0;
                  local_78.m_allocator = &defaultAllocator::m_def->super_Allocator;
                  iVar7 = (*(defaultAllocator::m_def->super_Allocator)._vptr_Allocator[2])
                                    (defaultAllocator::m_def,0x27,1);
                  local_78.m_cStr = (char *)CONCAT44(extraout_var_00,iVar7);
                  *(undefined8 *)
                   ((long)&(((ErrorCategory *)local_78.m_cStr)->m_name).m_capacity + 7) = 0;
                  (((ErrorCategory *)local_78.m_cStr)->m_name).m_length = 0;
                  (((ErrorCategory *)local_78.m_cStr)->m_name).m_capacity = 0;
                  ((ErrorCategory *)local_78.m_cStr)->_vptr_ErrorCategory = (_func_int **)0x0;
                  (((ErrorCategory *)local_78.m_cStr)->m_name).m_cStr = (char *)0x0;
                  if ((ErrorCategory *)local_78.m_cStr == (ErrorCategory *)0x0) goto LAB_0011be2a;
                  local_78.m_capacity = 0x26;
                  local_78.m_length = 0x26;
                  (((ErrorCategory *)local_78.m_cStr)->m_name).m_length = 0x7266207261686320;
                  (((ErrorCategory *)local_78.m_cStr)->m_name).m_capacity = 0x6420786568206d6f;
                  ((ErrorCategory *)local_78.m_cStr)->_vptr_ErrorCategory =
                       (_func_int **)0x786520726f727245;
                  (((ErrorCategory *)local_78.m_cStr)->m_name).m_cStr = (char *)0x676e697463617274;
                  *(undefined8 *)
                   ((long)&(((ErrorCategory *)local_78.m_cStr)->m_name).m_capacity + 7) =
                       0x21737469676964;
                  stick::Error::Error<stick::ec::MiscErrorCode>
                            (&local_d0,BadURI,&local_78,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/URI.cpp"
                             ,0x159,(type *)0x0);
                  _error->m_code = local_d0.m_code;
                  _error->m_category = local_d0.m_category;
                  pEVar12 = (ErrorCategory *)(_error->m_message).m_cStr;
                  if (pEVar12 != (ErrorCategory *)0x0) {
                    pAVar2 = (_error->m_message).m_allocator;
                    local_e8 = (_error->m_message).m_capacity + 1;
                    local_f0 = pEVar12;
                    (*pAVar2->_vptr_Allocator[3])(pAVar2,&local_f0);
                    (_error->m_message).m_cStr = (char *)0x0;
                    (_error->m_message).m_length = 0;
                    (_error->m_message).m_capacity = 0;
                  }
                  (_error->m_message).m_cStr = local_d0.m_message.m_cStr;
                  (_error->m_message).m_allocator = local_d0.m_message.m_allocator;
                  (_error->m_message).m_length = local_d0.m_message.m_length;
                  (_error->m_message).m_capacity = local_d0.m_message.m_capacity;
                  local_d0.m_message.m_cStr = (char *)0x0;
                  pEVar12 = (ErrorCategory *)(_error->m_file).m_cStr;
                  if (pEVar12 != (ErrorCategory *)0x0) {
                    pAVar2 = (_error->m_file).m_allocator;
                    local_e8 = (_error->m_file).m_capacity + 1;
                    local_f0 = pEVar12;
                    (*pAVar2->_vptr_Allocator[3])(pAVar2,&local_f0);
                    (_error->m_file).m_cStr = (char *)0x0;
                    (_error->m_file).m_length = 0;
                    (_error->m_file).m_capacity = 0;
                  }
                  (_error->m_file).m_cStr = local_d0.m_file.m_cStr;
                  (_error->m_file).m_allocator = local_d0.m_file.m_allocator;
                  (_error->m_file).m_length = local_d0.m_file.m_length;
                  (_error->m_file).m_capacity = local_d0.m_file.m_capacity;
                  local_d0.m_file.m_cStr = (char *)0x0;
                  _error->m_line = local_d0.m_line;
                  if ((ErrorCategory *)local_d0.m_message.m_cStr != (ErrorCategory *)0x0) {
                    local_e8 = local_d0.m_message.m_capacity + 1;
                    local_f0 = (ErrorCategory *)local_d0.m_message.m_cStr;
                    (*(local_d0.m_message.m_allocator)->_vptr_Allocator[3])
                              (local_d0.m_message.m_allocator,&local_f0);
                    local_d0.m_message.m_cStr = (char *)0x0;
                    local_d0.m_message.m_length = 0;
                    local_d0.m_message.m_capacity = 0;
                  }
                  pEVar12 = (ErrorCategory *)local_78.m_cStr;
                  if ((ErrorCategory *)local_78.m_cStr != (ErrorCategory *)0x0) {
                    local_e8 = local_78.m_capacity + 1;
                    local_f0 = (ErrorCategory *)local_78.m_cStr;
                    iVar7 = (*((Allocator *)&(local_78.m_allocator)->_vptr_Allocator)->
                              _vptr_Allocator[3])(local_78.m_allocator,&local_f0);
                    pEVar12 = (ErrorCategory *)CONCAT44(extraout_var_01,iVar7);
                    local_78.m_cStr = (char *)0x0;
                    local_78.m_length = 0;
                    local_78.m_capacity = 0;
                  }
                  local_e0 = CONCAT71((int7)((ulong)pEVar12 >> 8),1);
                }
                pSVar14 = (String *)tmp2.m_allocator;
                if (auStack_58 != (undefined1  [8])0x0) {
                  local_d0._8_8_ = tmp2.m_length + 1;
                  local_d0.m_category = (ErrorCategory *)auStack_58;
                  (**(code **)(*(long *)tmp2.m_capacity + 0x18))(tmp2.m_capacity,&local_d0);
                  auStack_58 = (undefined1  [8])0x0;
                  tmp2.m_cStr = (char *)0x0;
                  tmp2.m_length = 0;
                  pSVar14 = (String *)tmp2.m_allocator;
                }
                goto LAB_0011bc3d;
              }
              if (defaultAllocator()::m_def == '\0') {
                decode();
              }
              auStack_58 = (undefined1  [8])0x0;
              tmp2.m_cStr = (char *)0x0;
              tmp2.m_length = 0;
              tmp2.m_capacity = (Size)defaultAllocator::m_def;
              iVar7 = (*(defaultAllocator::m_def->super_Allocator)._vptr_Allocator[2])
                                (defaultAllocator::m_def,0x30,1);
              auStack_58 = (undefined1  [8])CONCAT44(extraout_var_04,iVar7);
              (((ErrorCategory *)auStack_58)->m_name).m_allocator = (Allocator *)0x0;
              ((ErrorCategory *)((long)auStack_58 + 0x28))->_vptr_ErrorCategory = (_func_int **)0x0;
              (((ErrorCategory *)auStack_58)->m_name).m_length = 0;
              (((ErrorCategory *)auStack_58)->m_name).m_capacity = 0;
              ((ErrorCategory *)auStack_58)->_vptr_ErrorCategory = (_func_int **)0x0;
              (((ErrorCategory *)auStack_58)->m_name).m_cStr = (char *)0x0;
              if (auStack_58 == (undefined1  [8])0x0) goto LAB_0011be2a;
              (((ErrorCategory *)auStack_58)->m_name).m_allocator = (Allocator *)0x7865682064696c61;
              ((ErrorCategory *)((long)auStack_58 + 0x28))->_vptr_ErrorCategory =
                   (_func_int **)0x21746967696420;
              (((ErrorCategory *)auStack_58)->m_name).m_length = 0x7369207469676964;
              (((ErrorCategory *)auStack_58)->m_name).m_capacity = 0x76206120746f6e20;
              ((ErrorCategory *)auStack_58)->_vptr_ErrorCategory = (_func_int **)0x6867696820656854;
              (((ErrorCategory *)auStack_58)->m_name).m_cStr = (char *)0x20776f6c20726f20;
              _line = 0x14f;
            }
          }
          tmp2.m_length = 0x2f;
          tmp2.m_cStr = (char *)0x2f;
          stick::Error::Error<stick::ec::MiscErrorCode>
                    (&local_d0,BadURI,(String *)auStack_58,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/URI.cpp"
                     ,_line,(type *)0x0);
          _error->m_code = local_d0.m_code;
          _error->m_category = local_d0.m_category;
          pEVar12 = (ErrorCategory *)(_error->m_message).m_cStr;
          if (pEVar12 != (ErrorCategory *)0x0) {
            pAVar2 = (_error->m_message).m_allocator;
            local_78.m_length = (_error->m_message).m_capacity + 1;
            local_78.m_cStr = (char *)pEVar12;
            (*pAVar2->_vptr_Allocator[3])(pAVar2,&local_78);
            (_error->m_message).m_cStr = (char *)0x0;
            (_error->m_message).m_length = 0;
            (_error->m_message).m_capacity = 0;
          }
          (_error->m_message).m_cStr = local_d0.m_message.m_cStr;
          (_error->m_message).m_allocator = local_d0.m_message.m_allocator;
          (_error->m_message).m_length = local_d0.m_message.m_length;
          (_error->m_message).m_capacity = local_d0.m_message.m_capacity;
          local_d0.m_message.m_cStr = (char *)0x0;
          pEVar12 = (ErrorCategory *)(_error->m_file).m_cStr;
          if (pEVar12 != (ErrorCategory *)0x0) {
            pAVar2 = (_error->m_file).m_allocator;
            local_78.m_length = (_error->m_file).m_capacity + 1;
            local_78.m_cStr = (char *)pEVar12;
            (*pAVar2->_vptr_Allocator[3])(pAVar2,&local_78);
            (_error->m_file).m_cStr = (char *)0x0;
            (_error->m_file).m_length = 0;
            (_error->m_file).m_capacity = 0;
          }
          (_error->m_file).m_cStr = local_d0.m_file.m_cStr;
          (_error->m_file).m_allocator = local_d0.m_file.m_allocator;
          (_error->m_file).m_length = local_d0.m_file.m_length;
          (_error->m_file).m_capacity = local_d0.m_file.m_capacity;
          local_d0.m_file.m_cStr = (char *)0x0;
          _error->m_line = local_d0.m_line;
          if ((ErrorCategory *)local_d0.m_message.m_cStr != (ErrorCategory *)0x0) {
            local_78.m_length = local_d0.m_message.m_capacity + 1;
            local_78.m_cStr = local_d0.m_message.m_cStr;
            (*(local_d0.m_message.m_allocator)->_vptr_Allocator[3])
                      (local_d0.m_message.m_allocator,&local_78);
            local_d0.m_message.m_cStr = (char *)0x0;
            local_d0.m_message.m_length = 0;
            local_d0.m_message.m_capacity = 0;
          }
          auVar13 = auStack_58;
          if (auStack_58 != (undefined1  [8])0x0) {
            local_78.m_length = tmp2.m_length + 1;
            local_78.m_cStr = (char *)auStack_58;
            auVar13 = (undefined1  [8])
                      (**(code **)(*(long *)tmp2.m_capacity + 0x18))(tmp2.m_capacity,&local_78);
            auStack_58 = (undefined1  [8])0x0;
            tmp2.m_cStr = (char *)0x0;
            tmp2.m_length = 0;
          }
          local_e0 = CONCAT71((int7)((ulong)auVar13 >> 8),1);
          bVar17 = false;
          pSVar14 = (String *)tmp2.m_allocator;
        }
        else {
          SVar3 = pSVar14->m_length;
          pp_Var8 = (_func_int **)(SVar3 + 1);
          if (((_func_int **)pSVar14->m_capacity < pp_Var8) &&
             (pp_Var4 = (_func_int **)((long)pp_Var8 * 2),
             (_func_int **)pSVar14->m_capacity < pp_Var4)) {
            local_d8 = (ErrorCategory *)pSVar14->m_cStr;
            iVar7 = (*pSVar14->m_allocator->_vptr_Allocator[2])
                              (pSVar14->m_allocator,(ulong)pp_Var4 | 1,1);
            (tmp2.m_allocator)->_vptr_Allocator = (_func_int **)CONCAT44(extraout_var_02,iVar7);
            memset((_func_int **)CONCAT44(extraout_var_02,iVar7),0,(ulong)pp_Var4 | 1);
            pEVar12 = local_d8;
            if ((tmp2.m_allocator)->_vptr_Allocator == (_func_int **)0x0) goto LAB_0011be2a;
            if (local_d8 != (ErrorCategory *)0x0) {
              strcpy((char *)(tmp2.m_allocator)->_vptr_Allocator,(char *)local_d8);
              local_d0._8_8_ = (long)tmp2.m_allocator[2]._vptr_Allocator + 1;
              local_d0.m_category = pEVar12;
              (**(code **)(*tmp2.m_allocator[3]._vptr_Allocator + 0x18))
                        (tmp2.m_allocator[3]._vptr_Allocator,&local_d0);
            }
            tmp2.m_allocator[2]._vptr_Allocator = pp_Var4;
            pSVar14 = (String *)tmp2.m_allocator;
          }
          pSVar14->m_length = (Size)pp_Var8;
          pSVar14->m_cStr[SVar3] = cVar1;
          bVar17 = true;
          pcVar15 = pcVar16;
        }
LAB_0011bc3d:
        if (!bVar17) {
          if ((local_e0 & 1) != 0) {
            return pSVar14;
          }
          local_d0.m_category = (ErrorCategory *)pSVar14->m_cStr;
          if (local_d0.m_category == (ErrorCategory *)0x0) {
            return pSVar14;
          }
          local_d0._8_8_ = (long)tmp2.m_allocator[2]._vptr_Allocator + 1;
          (*pSVar14->m_allocator->_vptr_Allocator[3])();
          (tmp2.m_allocator)->_vptr_Allocator = (_func_int **)0x0;
          tmp2.m_allocator[1]._vptr_Allocator = (_func_int **)0x0;
          tmp2.m_allocator[2]._vptr_Allocator = (_func_int **)0x0;
          return (String *)tmp2.m_allocator;
        }
        pcVar16 = pcVar15 + 1;
        pcVar9 = _str->m_cStr + _str->m_length;
      } while (pcVar16 != pcVar9);
    }
    return pSVar14;
  }
LAB_0011be2a:
  __assert_fail("m_cStr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/String.hpp"
                ,0x1a0,"void stick::String::reserve(Size)");
}

Assistant:

String URI::decode(const String & _str, Error & _error) const
{
    String ret;
    ret.reserve(128);
    String::ConstIter it = _str.begin();
    for (; it != _str.end(); ++it)
    {
        char c = *it;
        Int64 tmp;
        if (c == '%')
        {
            // std::stringstream strstr;
            it++;
            if (it == _str.end())
            {
                _error = Error(ec::BadURI,
                               "Two hex digits have to follow the percent sign!",
                               STICK_FILE,
                               STICK_LINE);
                return ret;
            }

            char hi = *it;
            it++;

            if (it == _str.end())
            {
                _error = Error(ec::BadURI,
                               "Two hex digits have to follow the percent sign!",
                               STICK_FILE,
                               STICK_LINE);
                return ret;
            }

            char lo = *it;

            if (!isxdigit(hi) || !isxdigit(lo))
            {
                _error = Error(ec::BadURI,
                               "The high or low digit is not a valid hex digit!",
                               STICK_FILE,
                               STICK_LINE);
                return ret;
            }

            String tmp2 = String::concat(hi, lo);
            errno = 0;
            tmp = strtol(tmp2.cString(), NULL, 16);
            if (errno != 0)
            {
                _error = Error(
                    ec::BadURI, "Error extracting char from hex digits!", STICK_FILE, STICK_LINE);
                return ret;
            }
            ret.append((char)tmp);
        }
        else
        {
            ret.append(*it);
        }
    }

    return ret;
}